

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.hpp
# Opt level: O1

void __thiscall
duckdb::Bit::BitToNumeric<duckdb::uhugeint_t>(Bit *this,bitstring_t bit,uhugeint_t *output_num)

{
  undefined4 uVar1;
  uint8_t uVar2;
  uint64_t *puVar3;
  char *pcVar4;
  ulong uVar6;
  anon_union_16_2_67f50693_for_value local_40;
  uhugeint_t local_30;
  undefined8 uVar5;
  
  puVar3 = bit.value._8_8_;
  local_40.pointer.ptr = (char *)bit.value._0_8_;
  local_40._0_8_ = this;
  uhugeint_t::uhugeint_t(&local_30,0);
  uVar5 = local_40.pointer.ptr;
  *puVar3 = local_30.lower;
  puVar3[1] = local_30.upper;
  uVar1 = local_40.pointer.length;
  uVar6 = local_40._0_8_ & 0xffffffff;
  uVar2 = GetFirstByte((bitstring_t *)&local_40.pointer);
  *(uint8_t *)((long)puVar3 + (uVar6 - 2)) = uVar2;
  if (0x12 - uVar6 < 0x10) {
    if ((uint)uVar1 < 0xd) {
      uVar5 = local_40.pointer.prefix;
    }
    pcVar4 = (char *)(uVar5 + 2);
    do {
      *(char *)((long)puVar3 + (uVar6 - 3)) = *pcVar4;
      uVar6 = uVar6 - 1;
      pcVar4 = pcVar4 + 1;
    } while (uVar6 != 2);
  }
  return;
}

Assistant:

void Bit::BitToNumeric(bitstring_t bit, T &output_num) {
	D_ASSERT(bit.GetSize() <= sizeof(T) + 1);

	output_num = 0;
	auto data = const_data_ptr_cast(bit.GetData());
	auto output = data_ptr_cast(&output_num);

	idx_t padded_byte_idx = sizeof(T) - bit.GetSize() + 1;
	output[sizeof(T) - 1 - padded_byte_idx] = GetFirstByte(bit);
	for (idx_t idx = padded_byte_idx + 1; idx < sizeof(T); ++idx) {
		output[sizeof(T) - 1 - idx] = data[1 + idx - padded_byte_idx];
	}
}